

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O2

void __thiscall llvm::DWARFGdbIndex::dump(DWARFGdbIndex *this,raw_ostream *OS)

{
  raw_ostream *prVar1;
  
  if (this->HasError == true) {
    raw_ostream::operator<<(OS,"\n<error parsing>\n");
    return;
  }
  if (this->HasContent == true) {
    prVar1 = raw_ostream::operator<<(OS,"  Version = ");
    prVar1 = raw_ostream::operator<<(prVar1,(ulong)this->Version);
    raw_ostream::operator<<(prVar1,'\n');
    dumpCUList(this,OS);
    dumpTUList(this,OS);
    dumpAddressArea(this,OS);
    dumpSymbolTable(this,OS);
    dumpConstantPool(this,OS);
    return;
  }
  return;
}

Assistant:

void DWARFGdbIndex::dump(raw_ostream &OS) {
  if (HasError) {
    OS << "\n<error parsing>\n";
    return;
  }

  if (HasContent) {
    OS << "  Version = " << Version << '\n';
    dumpCUList(OS);
    dumpTUList(OS);
    dumpAddressArea(OS);
    dumpSymbolTable(OS);
    dumpConstantPool(OS);
  }
}